

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

string * __thiscall
pbrt::MaterialHandle::ToString_abi_cxx11_(string *__return_storage_ptr__,MaterialHandle *this)

{
  ulong uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  SubsurfaceMaterial *this_00;
  allocator<char> local_9;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          ).bits;
  this_00 = (SubsurfaceMaterial *)(uVar1 & 0xffffffffffff);
  if (this_00 == (SubsurfaceMaterial *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"(nullptr)",&local_9);
  }
  else {
    uVar2 = (ushort)(uVar1 >> 0x30);
    uVar3 = (uint)uVar2;
    if ((uint)(uVar1 >> 0x31) < 3) {
      if (uVar3 < 3) {
        if (uVar3 == 2) {
          CoatedConductorMaterial::ToString_abi_cxx11_
                    (__return_storage_ptr__,(CoatedConductorMaterial *)this_00);
        }
        else {
          CoatedDiffuseMaterial::ToString_abi_cxx11_
                    (__return_storage_ptr__,(CoatedDiffuseMaterial *)this_00);
        }
      }
      else if (uVar3 - 2 < 2) {
        ConductorMaterial::ToString_abi_cxx11_(__return_storage_ptr__,(ConductorMaterial *)this_00);
      }
      else if (uVar3 - 2 == 2) {
        DielectricMaterial::ToString_abi_cxx11_
                  (__return_storage_ptr__,(DielectricMaterial *)this_00);
      }
      else {
        DiffuseMaterial::ToString_abi_cxx11_(__return_storage_ptr__,(DiffuseMaterial *)this_00);
      }
    }
    else {
      uVar4 = uVar2 - 5;
      if (uVar4 < 4) {
        if (uVar4 < 2) {
          DiffuseTransmissionMaterial::ToString_abi_cxx11_
                    (__return_storage_ptr__,(DiffuseTransmissionMaterial *)this_00);
        }
        else if (uVar4 == 2) {
          HairMaterial::ToString_abi_cxx11_(__return_storage_ptr__,(HairMaterial *)this_00);
        }
        else {
          MeasuredMaterial::ToString_abi_cxx11_(__return_storage_ptr__,(MeasuredMaterial *)this_00);
        }
      }
      else if ((uVar2 & 0xfffe) == 8) {
        SubsurfaceMaterial::ToString_abi_cxx11_(__return_storage_ptr__,this_00);
      }
      else if (uVar3 - 9 < 2) {
        ThinDielectricMaterial::ToString_abi_cxx11_
                  (__return_storage_ptr__,(ThinDielectricMaterial *)this_00);
      }
      else {
        MixMaterial::ToString_abi_cxx11_(__return_storage_ptr__,(MixMaterial *)this_00);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MaterialHandle::ToString() const {
    if (ptr() == nullptr)
        return "(nullptr)";

    auto toStr = [](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(toStr);
}